

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O1

double __thiscall chrono::utils::ChRunningAverage::Add(ChRunningAverage *this,double val)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  size_t sVar4;
  ChRunningAverage *pCVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  
  iVar1 = this->m_n;
  iVar2 = this->m_index;
  this->m_index = iVar2 + 1;
  pdVar3 = (this->m_data)._M_data;
  pdVar3[iVar2 % iVar1] = val;
  pCVar5 = (ChRunningAverage *)&this->m_index;
  if (iVar1 <= iVar2) {
    pCVar5 = this;
  }
  iVar1 = pCVar5->m_n;
  sVar4 = (this->m_data)._M_size;
  dVar10 = *pdVar3;
  if (sVar4 != 1) {
    lVar6 = 8;
    do {
      dVar10 = dVar10 + *(double *)((long)pdVar3 + lVar6);
      lVar6 = lVar6 + 8;
    } while (sVar4 * 8 - lVar6 != 0);
  }
  dVar10 = dVar10 / (double)iVar1;
  dVar7 = 0.0;
  dVar8 = 0.0;
  if (iVar1 != 1) {
    if ((sVar4 != 0) &&
       (dVar7 = (pdVar3[sVar4 - 1] - dVar10) * (pdVar3[sVar4 - 1] - dVar10), sVar4 != 1)) {
      do {
        dVar8 = (this->m_data)._M_data[sVar4 - 2] - dVar10;
        dVar7 = dVar7 + dVar8 * dVar8;
        sVar4 = sVar4 - 1;
      } while (sVar4 != 1);
    }
    auVar9._0_8_ = dVar7 / (double)(iVar1 + -1);
    auVar9._8_8_ = 0;
    if (auVar9._0_8_ < 0.0) {
      dVar8 = sqrt(auVar9._0_8_);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      dVar8 = auVar9._0_8_;
    }
  }
  this->m_std = dVar8;
  return dVar10;
}

Assistant:

double ChRunningAverage::Add(double val) {
    m_data[(m_index++) % m_n] = val;
    int size = std::min(m_index, m_n);
    double mean = m_data.sum() / size;
    m_std = (size == 1) ? 0 : std::sqrt(std::pow(m_data - mean, 2.0).sum() / (size - 1));
    return mean;
}